

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

double __thiscall ON_DimStyle::MaskBorder(ON_DimStyle *this)

{
  ON_TextMask *this_00;
  double dVar1;
  ON_DimStyle *this_local;
  
  this_00 = TextMask(this);
  dVar1 = ON_TextMask::MaskBorder(this_00);
  return dVar1;
}

Assistant:

double ON_DimStyle::MaskBorder() const
{
  // This function is for legacy compatibility.
  // In October 2016, text mask information was moved from
  // a collection of individual values on ON_DimStyle to
  // an ON_TextMask class and a single ON_TextMask m_text_mask member
  // on ON_DimStyle.
  return TextMask().MaskBorder();
}